

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O0

int __thiscall
btGeneric6DofConstraint::get_limit_motor_info2
          (btGeneric6DofConstraint *this,btRotationalLimitMotor *limot,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB,btConstraintInfo2 *info,int row,btVector3 *ax1,int rotational,
          int rotAllowed)

{
  float *pfVar1;
  float vel_00;
  btScalar *pbVar2;
  btVector3 *v2;
  btTransform *in_RCX;
  btTransform *in_RDX;
  float *in_RSI;
  btTypedConstraint *in_RDI;
  btVector3 *in_R8;
  btVector3 *in_R9;
  btScalar bVar3;
  btScalar bVar4;
  btVector3 bVar5;
  btVector3 *in_stack_00000008;
  btVector3 *in_stack_00000010;
  float *in_stack_00000018;
  int in_stack_00000020;
  btVector3 *in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  btScalar newc_1;
  btScalar newc;
  btScalar vel;
  btScalar k;
  btScalar mot_fact;
  btScalar tag_vel;
  btVector3 c;
  btVector3 ltd;
  int i;
  btVector3 totalDist;
  btScalar desiredOffs;
  btVector3 orthoA;
  btVector3 projA;
  btVector3 orthoB;
  btVector3 projB;
  btVector3 relB;
  btVector3 relA;
  btVector3 tmpB;
  btVector3 tmpA;
  btScalar *J2;
  btScalar *J1;
  int limit;
  int powered;
  int srow;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  btVector3 *in_stack_fffffffffffffd68;
  btVector3 *in_stack_fffffffffffffd70;
  btVector3 *this_00;
  long local_228;
  long local_220;
  float local_208;
  btScalar local_1e8 [2];
  btScalar local_1e0 [6];
  btScalar local_1c8 [2];
  btScalar abStack_1c0 [6];
  btVector3 local_1a8;
  int local_198;
  btScalar local_194 [4];
  btScalar local_184 [4];
  btScalar local_174 [4];
  btScalar local_164 [4];
  btScalar local_154 [4];
  btScalar local_144 [4];
  btScalar local_134 [4];
  btScalar local_124 [4];
  btScalar local_114 [4];
  float local_104;
  btScalar local_100 [4];
  btScalar local_f0;
  btScalar local_ec [4];
  btScalar local_dc [4];
  btScalar local_cc [4];
  btScalar local_bc;
  btScalar local_b8 [4];
  btScalar local_a8 [4];
  btVector3 local_98;
  btVector3 local_88;
  btVector3 local_78;
  btVector3 local_68;
  long local_58;
  long local_50;
  float local_44;
  uint local_40;
  int local_3c;
  btVector3 *local_38;
  btVector3 *local_30;
  btTransform *local_28;
  btTransform *local_20;
  float *local_18;
  int local_4;
  
  local_3c = in_stack_00000020 * (int)in_stack_00000018[10];
  local_40 = (uint)(*(byte *)(in_RSI + 0xb) & 1);
  local_44 = in_RSI[0xe];
  if ((local_40 == 0) && (local_44 == 0.0)) {
    local_4 = 0;
  }
  else {
    if (in_stack_00000030 == 0) {
      local_220 = *(long *)(in_stack_00000018 + 2);
    }
    else {
      local_220 = *(long *)(in_stack_00000018 + 4);
    }
    local_50 = local_220;
    if (in_stack_00000030 == 0) {
      local_228 = *(long *)(in_stack_00000018 + 6);
    }
    else {
      local_228 = *(long *)(in_stack_00000018 + 8);
    }
    local_58 = local_228;
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    pbVar2 = btVector3::operator_cast_to_float_(in_stack_00000028);
    *(btScalar *)(local_50 + (long)local_3c * 4) = *pbVar2;
    pbVar2 = btVector3::operator_cast_to_float_(in_stack_00000028);
    *(btScalar *)(local_50 + (long)(local_3c + 1) * 4) = pbVar2[1];
    pbVar2 = btVector3::operator_cast_to_float_(in_stack_00000028);
    *(btScalar *)(local_50 + (long)(local_3c + 2) * 4) = pbVar2[2];
    pbVar2 = btVector3::operator_cast_to_float_(in_stack_00000028);
    *(float *)(local_58 + (long)local_3c * 4) = -*pbVar2;
    pbVar2 = btVector3::operator_cast_to_float_(in_stack_00000028);
    *(float *)(local_58 + (long)(local_3c + 1) * 4) = -pbVar2[1];
    pbVar2 = btVector3::operator_cast_to_float_(in_stack_00000028);
    *(float *)(local_58 + (long)(local_3c + 2) * 4) = -pbVar2[2];
    if (in_stack_00000030 == 0) {
      if ((in_RDI[0x12].m_needsFeedback & 1U) == 0) {
        this_00 = &local_1a8;
        btVector3::btVector3(this_00);
        v2 = btTransform::getOrigin((btTransform *)(in_RDI + 0x10));
        btTransform::getOrigin(local_20);
        operator-(this_00,v2);
        bVar5 = btVector3::cross(this_00,v2);
        local_1c8 = bVar5.m_floats._0_8_;
        abStack_1c0._0_8_ = bVar5.m_floats._8_8_;
        local_1a8.m_floats[0] = local_1c8[0];
        local_1a8.m_floats[1] = local_1c8[1];
        local_1a8.m_floats[2] = abStack_1c0[0];
        local_1a8.m_floats[3] = abStack_1c0[1];
        pbVar2 = btVector3::operator_cast_to_float_(this_00);
        *(btScalar *)(*(long *)(in_stack_00000018 + 4) + (long)local_3c * 4) = *pbVar2;
        pbVar2 = btVector3::operator_cast_to_float_(this_00);
        *(btScalar *)(*(long *)(in_stack_00000018 + 4) + 4 + (long)local_3c * 4) = pbVar2[1];
        pbVar2 = btVector3::operator_cast_to_float_(this_00);
        *(btScalar *)(*(long *)(in_stack_00000018 + 4) + 8 + (long)local_3c * 4) = pbVar2[2];
        btTransform::getOrigin((btTransform *)(in_RDI + 0x10));
        btTransform::getOrigin(local_28);
        operator-(this_00,v2);
        btVector3::cross(this_00,v2);
        bVar5 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60)
                         );
        local_1e8 = bVar5.m_floats._0_8_;
        local_1a8.m_floats[0] = local_1e8[0];
        local_1a8.m_floats[1] = local_1e8[1];
        local_1e0._0_8_ = bVar5.m_floats._8_8_;
        local_1a8.m_floats[2] = local_1e0[0];
        local_1a8.m_floats[3] = local_1e0[1];
        pbVar2 = btVector3::operator_cast_to_float_(&local_1a8);
        *(btScalar *)(*(long *)(in_stack_00000018 + 8) + (long)local_3c * 4) = *pbVar2;
        pbVar2 = btVector3::operator_cast_to_float_(&local_1a8);
        *(btScalar *)(*(long *)(in_stack_00000018 + 8) + (long)(local_3c + 1) * 4) = pbVar2[1];
        pbVar2 = btVector3::operator_cast_to_float_(&local_1a8);
        *(btScalar *)(*(long *)(in_stack_00000018 + 8) + (long)(local_3c + 2) * 4) = pbVar2[2];
      }
      else {
        btVector3::btVector3(&local_68);
        btVector3::btVector3(&local_78);
        btVector3::btVector3(&local_88);
        btVector3::btVector3(&local_98);
        btTransform::getOrigin((btTransform *)(in_RDI + 0x10));
        btTransform::getOrigin(local_28);
        bVar5 = operator-(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        local_a8._0_8_ = bVar5.m_floats._0_8_;
        local_a8._8_8_ = bVar5.m_floats._8_8_;
        local_98.m_floats[0] = local_a8[0];
        local_98.m_floats[1] = local_a8[1];
        local_98.m_floats[2] = local_a8[2];
        local_98.m_floats[3] = local_a8[3];
        local_a8 = bVar5.m_floats;
        local_bc = btVector3::dot(&local_98,in_stack_00000028);
        local_b8 = (btScalar  [4])
                   ::operator*(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68->m_floats);
        local_cc = (btScalar  [4])operator-(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        btTransform::getOrigin((btTransform *)&in_RDI[0xf].super_btTypedObject);
        btTransform::getOrigin(local_20);
        bVar5 = operator-(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        local_dc._0_8_ = bVar5.m_floats._0_8_;
        local_dc._8_8_ = bVar5.m_floats._8_8_;
        local_88.m_floats[0] = local_dc[0];
        local_88.m_floats[1] = local_dc[1];
        local_88.m_floats[2] = local_dc[2];
        local_88.m_floats[3] = local_dc[3];
        local_dc = bVar5.m_floats;
        local_f0 = btVector3::dot(&local_88,in_stack_00000028);
        local_ec = (btScalar  [4])
                   ::operator*(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68->m_floats);
        local_100 = (btScalar  [4])operator-(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        local_104 = local_18[0xd] - local_18[0xc];
        local_134 = (btScalar  [4])
                    ::operator*(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68->m_floats);
        local_124 = (btScalar  [4])operator+(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        local_114 = (btScalar  [4])operator-(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        local_154 = (btScalar  [4])
                    ::operator*(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68->m_floats);
        bVar5 = operator+(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        local_144._0_8_ = bVar5.m_floats._0_8_;
        local_144._8_8_ = bVar5.m_floats._8_8_;
        local_88.m_floats[0] = local_144[0];
        local_88.m_floats[1] = local_144[1];
        local_88.m_floats[2] = local_144[2];
        local_88.m_floats[3] = local_144[3];
        local_144 = bVar5.m_floats;
        local_174 = (btScalar  [4])
                    ::operator*(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68->m_floats);
        bVar5 = operator-(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        local_164._0_8_ = bVar5.m_floats._0_8_;
        local_164._8_8_ = bVar5.m_floats._8_8_;
        local_98.m_floats[0] = local_164[0];
        local_98.m_floats[1] = local_164[1];
        local_98.m_floats[2] = local_164[2];
        local_98.m_floats[3] = local_164[3];
        local_164 = bVar5.m_floats;
        bVar5 = btVector3::cross(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        local_184._0_8_ = bVar5.m_floats._0_8_;
        local_184._8_8_ = bVar5.m_floats._8_8_;
        local_68.m_floats[0] = local_184[0];
        local_68.m_floats[1] = local_184[1];
        local_68.m_floats[2] = local_184[2];
        local_68.m_floats[3] = local_184[3];
        local_184 = bVar5.m_floats;
        bVar5 = btVector3::cross(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        local_194._0_8_ = bVar5.m_floats._0_8_;
        local_78.m_floats[0] = local_194[0];
        local_78.m_floats[1] = local_194[1];
        local_194._8_8_ = bVar5.m_floats._8_8_;
        local_78.m_floats[2] = local_194[2];
        local_78.m_floats[3] = local_194[3];
        local_194 = bVar5.m_floats;
        if (((in_RDI[0x12].super_btTypedObject.m_objectType & 1) != 0) && (in_stack_00000038 == 0))
        {
          btVector3::operator*=(&local_68,(btScalar *)(in_RDI + 0x12));
          btVector3::operator*=
                    (&local_78,(btScalar *)((long)&in_RDI[0x12]._vptr_btTypedConstraint + 4));
        }
        for (local_198 = 0; local_198 < 3; local_198 = local_198 + 1) {
          pbVar2 = btVector3::operator_cast_to_float_(&local_68);
          *(btScalar *)(*(long *)(in_stack_00000018 + 4) + (long)(local_3c + local_198) * 4) =
               pbVar2[local_198];
        }
        for (local_198 = 0; local_198 < 3; local_198 = local_198 + 1) {
          pbVar2 = btVector3::operator_cast_to_float_(&local_78);
          *(float *)(*(long *)(in_stack_00000018 + 8) + (long)(local_3c + local_198) * 4) =
               -pbVar2[local_198];
        }
      }
    }
    if (local_44 != 0.0) {
      if ((*local_18 == local_18[1]) && (!NAN(*local_18) && !NAN(local_18[1]))) {
        local_40 = 0;
      }
    }
    *(undefined4 *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_3c * 4) = 0;
    if ((local_40 != 0) &&
       (*(float *)(*(long *)(in_stack_00000018 + 0xe) + (long)local_3c * 4) = local_18[7],
       local_44 == 0.0)) {
      if (in_stack_00000030 == 0) {
        vel_00 = -local_18[2];
      }
      else {
        vel_00 = local_18[2];
      }
      bVar3 = btTypedConstraint::getMotorFactor
                        (in_RDI,local_18[0xd],*local_18,local_18[1],vel_00,
                         *in_stack_00000018 * local_18[8]);
      *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_3c * 4) =
           bVar3 * local_18[2] + *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_3c * 4)
      ;
      *(float *)(*(long *)(in_stack_00000018 + 0x10) + (long)local_3c * 4) = -local_18[3];
      *(float *)(*(long *)(in_stack_00000018 + 0x12) + (long)local_3c * 4) = local_18[3];
    }
    if (local_44 != 0.0) {
      if (in_stack_00000030 == 0) {
        *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_3c * 4) =
             *in_stack_00000018 * local_18[8] * local_18[0xc] +
             *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_3c * 4);
      }
      else {
        *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_3c * 4) =
             -(*in_stack_00000018 * local_18[8]) * local_18[0xc] +
             *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_3c * 4);
      }
      *(float *)(*(long *)(in_stack_00000018 + 0xe) + (long)local_3c * 4) = local_18[9];
      if ((*local_18 != local_18[1]) || (NAN(*local_18) || NAN(local_18[1]))) {
        if (local_44 == 1.4013e-45) {
          *(undefined4 *)(*(long *)(in_stack_00000018 + 0x10) + (long)local_3c * 4) = 0;
          *(undefined4 *)(*(long *)(in_stack_00000018 + 0x12) + (long)local_3c * 4) = 0x7f7fffff;
        }
        else {
          *(undefined4 *)(*(long *)(in_stack_00000018 + 0x10) + (long)local_3c * 4) = 0xff7fffff;
          *(undefined4 *)(*(long *)(in_stack_00000018 + 0x12) + (long)local_3c * 4) = 0;
        }
        if (0.0 < local_18[10]) {
          if (in_stack_00000030 == 0) {
            bVar3 = btVector3::dot(local_30,in_stack_00000028);
            bVar4 = btVector3::dot(local_38,in_stack_00000028);
            local_208 = bVar3 - bVar4;
          }
          else {
            bVar3 = btVector3::dot(in_stack_00000008,in_stack_00000028);
            bVar4 = btVector3::dot(in_stack_00000010,in_stack_00000028);
            local_208 = bVar3 - bVar4;
          }
          if (local_44 == 1.4013e-45) {
            if ((local_208 < 0.0) &&
               (local_208 = -local_18[10] * local_208,
               pfVar1 = (float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_3c * 4),
               *pfVar1 <= local_208 && local_208 != *pfVar1)) {
              *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_3c * 4) = local_208;
            }
          }
          else if ((0.0 < local_208) &&
                  (-local_18[10] * local_208 <
                   *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_3c * 4))) {
            *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_3c * 4) =
                 -local_18[10] * local_208;
          }
        }
      }
      else {
        *(undefined4 *)(*(long *)(in_stack_00000018 + 0x10) + (long)local_3c * 4) = 0xff7fffff;
        *(undefined4 *)(*(long *)(in_stack_00000018 + 0x12) + (long)local_3c * 4) = 0x7f7fffff;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int btGeneric6DofConstraint::get_limit_motor_info2(
	btRotationalLimitMotor * limot,
	const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB,
	btConstraintInfo2 *info, int row, btVector3& ax1, int rotational,int rotAllowed)
{
    int srow = row * info->rowskip;
    int powered = limot->m_enableMotor;
    int limit = limot->m_currentLimit;
    if (powered || limit)
    {   // if the joint is powered, or has joint limits, add in the extra row
        btScalar *J1 = rotational ? info->m_J1angularAxis : info->m_J1linearAxis;
        btScalar *J2 = rotational ? info->m_J2angularAxis : info->m_J2linearAxis;
        J1[srow+0] = ax1[0];
        J1[srow+1] = ax1[1];
        J1[srow+2] = ax1[2];

        J2[srow+0] = -ax1[0];
        J2[srow+1] = -ax1[1];
        J2[srow+2] = -ax1[2];

		if((!rotational))
        {
			if (m_useOffsetForConstraintFrame)
			{
				btVector3 tmpA, tmpB, relA, relB;
				// get vector from bodyB to frameB in WCS
				relB = m_calculatedTransformB.getOrigin() - transB.getOrigin();
				// get its projection to constraint axis
				btVector3 projB = ax1 * relB.dot(ax1);
				// get vector directed from bodyB to constraint axis (and orthogonal to it)
				btVector3 orthoB = relB - projB;
				// same for bodyA
				relA = m_calculatedTransformA.getOrigin() - transA.getOrigin();
				btVector3 projA = ax1 * relA.dot(ax1);
				btVector3 orthoA = relA - projA;
				// get desired offset between frames A and B along constraint axis
				btScalar desiredOffs = limot->m_currentPosition - limot->m_currentLimitError;
				// desired vector from projection of center of bodyA to projection of center of bodyB to constraint axis
				btVector3 totalDist = projA + ax1 * desiredOffs - projB;
				// get offset vectors relA and relB
				relA = orthoA + totalDist * m_factA;
				relB = orthoB - totalDist * m_factB;
				tmpA = relA.cross(ax1);
				tmpB = relB.cross(ax1);
				if(m_hasStaticBody && (!rotAllowed))
				{
					tmpA *= m_factA;
					tmpB *= m_factB;
				}
				int i;
				for (i=0; i<3; i++) info->m_J1angularAxis[srow+i] = tmpA[i];
				for (i=0; i<3; i++) info->m_J2angularAxis[srow+i] = -tmpB[i];
			} else
			{
				btVector3 ltd;	// Linear Torque Decoupling vector
				btVector3 c = m_calculatedTransformB.getOrigin() - transA.getOrigin();
				ltd = c.cross(ax1);
				info->m_J1angularAxis[srow+0] = ltd[0];
				info->m_J1angularAxis[srow+1] = ltd[1];
				info->m_J1angularAxis[srow+2] = ltd[2];

				c = m_calculatedTransformB.getOrigin() - transB.getOrigin();
				ltd = -c.cross(ax1);
				info->m_J2angularAxis[srow+0] = ltd[0];
				info->m_J2angularAxis[srow+1] = ltd[1];
				info->m_J2angularAxis[srow+2] = ltd[2];
			}
        }
        // if we're limited low and high simultaneously, the joint motor is
        // ineffective
        if (limit && (limot->m_loLimit == limot->m_hiLimit)) powered = 0;
        info->m_constraintError[srow] = btScalar(0.f);
        if (powered)
        {
			info->cfm[srow] = limot->m_normalCFM;
            if(!limit)
            {
				btScalar tag_vel = rotational ? limot->m_targetVelocity : -limot->m_targetVelocity;

				btScalar mot_fact = getMotorFactor(	limot->m_currentPosition, 
													limot->m_loLimit,
													limot->m_hiLimit, 
													tag_vel, 
													info->fps * limot->m_stopERP);
				info->m_constraintError[srow] += mot_fact * limot->m_targetVelocity;
                info->m_lowerLimit[srow] = -limot->m_maxMotorForce;
                info->m_upperLimit[srow] = limot->m_maxMotorForce;
            }
        }
        if(limit)
        {
            btScalar k = info->fps * limot->m_stopERP;
			if(!rotational)
			{
				info->m_constraintError[srow] += k * limot->m_currentLimitError;
			}
			else
			{
				info->m_constraintError[srow] += -k * limot->m_currentLimitError;
			}
			info->cfm[srow] = limot->m_stopCFM;
            if (limot->m_loLimit == limot->m_hiLimit)
            {   // limited low and high simultaneously
                info->m_lowerLimit[srow] = -SIMD_INFINITY;
                info->m_upperLimit[srow] = SIMD_INFINITY;
            }
            else
            {
                if (limit == 1)
                {
                    info->m_lowerLimit[srow] = 0;
                    info->m_upperLimit[srow] = SIMD_INFINITY;
                }
                else
                {
                    info->m_lowerLimit[srow] = -SIMD_INFINITY;
                    info->m_upperLimit[srow] = 0;
                }
                // deal with bounce
                if (limot->m_bounce > 0)
                {
                    // calculate joint velocity
                    btScalar vel;
                    if (rotational)
                    {
                        vel = angVelA.dot(ax1);
//make sure that if no body -> angVelB == zero vec
//                        if (body1)
                            vel -= angVelB.dot(ax1);
                    }
                    else
                    {
                        vel = linVelA.dot(ax1);
//make sure that if no body -> angVelB == zero vec
//                        if (body1)
                            vel -= linVelB.dot(ax1);
                    }
                    // only apply bounce if the velocity is incoming, and if the
                    // resulting c[] exceeds what we already have.
                    if (limit == 1)
                    {
                        if (vel < 0)
                        {
                            btScalar newc = -limot->m_bounce* vel;
                            if (newc > info->m_constraintError[srow]) 
								info->m_constraintError[srow] = newc;
                        }
                    }
                    else
                    {
                        if (vel > 0)
                        {
                            btScalar newc = -limot->m_bounce * vel;
                            if (newc < info->m_constraintError[srow]) 
								info->m_constraintError[srow] = newc;
                        }
                    }
                }
            }
        }
        return 1;
    }
    else return 0;
}